

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGraph.cpp
# Opt level: O0

void __thiscall Hpipe::InstructionGraph::train(InstructionGraph *this,bool only_cont)

{
  Instruction *this_00;
  bool bVar1;
  size_type sVar2;
  size_type local_b8;
  size_type m;
  size_type s;
  string inp;
  TrainingData *td;
  iterator __end2;
  iterator __begin2;
  Vec<Hpipe::Lexer::TrainingData> *__range2;
  anon_class_1_0_00000001 local_51;
  function<void_(Hpipe::Instruction_*)> local_50;
  undefined1 local_30 [8];
  Vec<Hpipe::Lexer::TrainingData> tds;
  bool only_cont_local;
  InstructionGraph *this_local;
  
  tds.super_vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>.
  super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = only_cont;
  CharGraph::training_data((Vec<Hpipe::Lexer::TrainingData> *)local_30,this->cg);
  sVar2 = std::vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>::size
                    ((vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>
                      *)local_30);
  if (sVar2 != 0) {
    this_00 = this->init;
    std::function<void(Hpipe::Instruction*)>::
    function<Hpipe::InstructionGraph::train(bool)::__0,void>
              ((function<void(Hpipe::Instruction*)> *)&local_50,&local_51);
    Instruction::apply(this_00,&local_50,true);
    std::function<void_(Hpipe::Instruction_*)>::~function(&local_50);
    __end2 = std::vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>::
             begin((vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>
                    *)local_30);
    td = (TrainingData *)
         std::vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>::end
                   ((vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>
                     *)local_30);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Hpipe::Lexer::TrainingData_*,_std::vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>_>
                                       *)&td), bVar1) {
      inp.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<Hpipe::Lexer::TrainingData_*,_std::vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>_>
           ::operator*(&__end2);
      std::__cxx11::string::string((string *)&s,(string *)&((reference)inp.field_2._8_8_)->inp);
      m = 0;
      if ((tds.super_vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>
           .
           super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
        Instruction::train_rec
                  (this->init,&m,&local_b8,(string *)&s,*(double *)(inp.field_2._8_8_ + 0x20),false)
        ;
      }
      m = 0;
      Instruction::train_rec
                (this->init,&m,&local_b8,(string *)&s,*(double *)(inp.field_2._8_8_ + 0x20),true);
      std::__cxx11::string::~string((string *)&s);
      __gnu_cxx::
      __normal_iterator<Hpipe::Lexer::TrainingData_*,_std::vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>_>
      ::operator++(&__end2);
    }
  }
  Vec<Hpipe::Lexer::TrainingData>::~Vec((Vec<Hpipe::Lexer::TrainingData> *)local_30);
  return;
}

Assistant:

void InstructionGraph::train( bool only_cont ) {
    Vec<Lexer::TrainingData> tds = cg->training_data();
    if ( tds.size() ) {
        init->apply( []( Instruction *inst ) {
            for( Transition &t : inst->next )
                t.freq = 0.0;
            inst->freq.assign( 256, 0.0 );
            inst->cum_freq = 0.0;
        }, true );

        for( const Lexer::TrainingData &td : tds ) {
            const std::string inp = td.inp;
            // without contiguous data
            std::string::size_type s = 0, m;
            if ( not only_cont ) {
                init->train_rec( s, m, inp, td.freq, false );
                // with contiguous data
                s = 0;
            }
            init->train_rec( s, m, inp, td.freq, true );
        }
    }
}